

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compress_3d.cpp
# Opt level: O2

size_t prediction_and_quantization_3d<float>
                 (float *data,DSize_3d *size,meanInfo<float> *mean_info,double precision,
                 int capacity,int intv_radius,uchar *indicator,int *type,int *reg_params_type,
                 float **reg_unpredictable_data_pos,float **unpredictable_data_pos)

{
  ulong uVar1;
  int size_x;
  int size_y;
  int size_z;
  int iVar2;
  float *buffer;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float *z_data_pos;
  float fVar8;
  float *local_f8;
  uchar *local_e8;
  size_t local_c8;
  int *local_b8;
  int *type_pos;
  void *local_90;
  float *local_88;
  float *local_80;
  ulong local_78;
  size_t local_70;
  ulong local_68;
  ulong local_60;
  double reg_precisions [4];
  
  local_b8 = reg_params_type;
  type_pos = type;
  local_90 = malloc(size->num_blocks * 0x10 + 0x10);
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    *(undefined4 *)((long)local_90 + lVar3 * 4) = 0;
  }
  fVar8 = (float)(precision * 0.1 * 0.25);
  iVar2 = size->block_size;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    reg_precisions[lVar3] = (double)(fVar8 / (float)iVar2);
  }
  local_f8 = (float *)((long)local_90 + 0x10);
  reg_precisions[3] = (double)fVar8;
  local_70 = (long)iVar2 + 1;
  iVar4 = (int)local_70;
  local_78 = (ulong)(uint)(iVar4 * iVar4);
  buffer = (float *)calloc(1,(long)(iVar4 * iVar4 * iVar4) << 2);
  iVar4 = capacity + -2;
  if (mean_info->use_mean == false) {
    iVar4 = capacity;
  }
  local_c8 = 0;
  uVar5 = 0;
  local_e8 = indicator;
  do {
    if (size->num_x <= uVar5) {
      free(buffer);
      free(local_90);
      return local_c8;
    }
    uVar1 = uVar5 + 1;
    uVar6 = 0;
    local_88 = data;
    local_68 = uVar5;
    while (uVar6 < size->num_y) {
      uVar7 = 0;
      local_80 = data;
      local_60 = uVar6;
      while( true ) {
        iVar2 = size->block_size;
        lVar3 = (long)iVar2;
        if (size->num_z <= uVar7) break;
        size_x = (int)size->d1 - (int)uVar5 * iVar2;
        if (uVar1 * lVar3 < size->d1) {
          size_x = iVar2;
        }
        size_y = (int)size->d2 - (int)local_60 * iVar2;
        if ((uVar6 + 1) * lVar3 < size->d2) {
          size_y = iVar2;
        }
        size_z = (int)size->d3 - (int)uVar7 * iVar2;
        if (lVar3 * (uVar7 + 1) < size->d3) {
          size_z = iVar2;
        }
        iVar2 = size_y;
        if (size_x < size_y) {
          iVar2 = size_x;
        }
        if (size_z <= iVar2) {
          iVar2 = size_z;
        }
        if (iVar2 < 4) {
          local_e8[uVar7] = '\0';
LAB_00104c5a:
          block_pred_and_quant_lorenzo_3d<float>
                    (mean_info,data,buffer,precision,iVar4,intv_radius,size_x,size_y,size_z,local_78
                     ,local_70,size->dim0_offset,size->dim1_offset,&type_pos,unpredictable_data_pos)
          ;
        }
        else {
          compute_regression_coeffcients_3d<float>
                    (data,size_x,size_y,size_z,size->dim0_offset,size->dim1_offset,local_f8);
          iVar2 = sz_blockwise_selection_3d<float>
                            (data,mean_info,size->dim0_offset,size->dim1_offset,iVar2,
                             (float)(precision * 1.22),local_f8);
          local_e8[uVar7] = (uchar)iVar2;
          if ((uchar)iVar2 == '\0') goto LAB_00104c5a;
          compress_regression_coefficient_3d
                    (reg_precisions,local_f8,local_b8,reg_unpredictable_data_pos);
          block_pred_and_quant_regression_3d<float>
                    (data,local_f8,precision,capacity,intv_radius,size_x,size_y,size_z,
                     size->dim0_offset,size->dim1_offset,&type_pos,unpredictable_data_pos);
          local_c8 = local_c8 + 1;
          local_f8 = local_f8 + 4;
          local_b8 = local_b8 + 4;
        }
        data = data + size_z;
        uVar5 = local_68;
        uVar7 = uVar7 + 1;
      }
      data = local_80 + lVar3 * size->dim1_offset;
      local_e8 = local_e8 + uVar7;
      uVar6 = uVar6 + 1;
    }
    data = local_88 + (long)iVar2 * size->dim0_offset;
    uVar5 = uVar1;
  } while( true );
}

Assistant:

size_t
prediction_and_quantization_3d(const T * data, const DSize_3d& size, const meanInfo<T>& mean_info, double precision,
	int capacity, int intv_radius, unsigned char * indicator, int * type, 
	int * reg_params_type, float *& reg_unpredictable_data_pos, T *& unpredictable_data_pos){
	const float noise = precision * LorenzeNoise3d;
	int * type_pos = type;
	unsigned char * indicator_pos = indicator;
	float * reg_params = (float *) malloc(RegCoeffNum3d * (size.num_blocks+1) * sizeof(float));
	for(int i=0; i<RegCoeffNum3d; i++)
		reg_params[i] = 0;
	float * reg_params_pos = reg_params + RegCoeffNum3d;
	int * reg_params_type_pos = reg_params_type;
	double reg_precisions[RegCoeffNum3d];
	float rel_param_err = RegErrThreshold * precision / RegCoeffNum3d;
	for(int i=0; i<RegCoeffNum3d-1; i++) 
		reg_precisions[i] = rel_param_err / size.block_size;
	reg_precisions[RegCoeffNum3d - 1] = rel_param_err;
	size_t buffer_dim0_offset = (size.block_size + 1) * (size.block_size + 1);
	size_t buffer_dim1_offset = size.block_size + 1;
	T * pred_buffer = (T *) malloc((size.block_size+1)*(size.block_size+1)*(size.block_size+1)*sizeof(T));
	memset(pred_buffer, 0, (size.block_size+1)*(size.block_size+1)*(size.block_size+1)*sizeof(T));
	size_t reg_count = 0;
	int capacity_lorenzo = mean_info.use_mean ? capacity - 2 : capacity;
	const T * x_data_pos = data;
	for(size_t i=0; i<size.num_x; i++){
		const T * y_data_pos = x_data_pos;
		for(size_t j=0; j<size.num_y; j++){
			const T * z_data_pos = y_data_pos;
			for(size_t k=0; k<size.num_z; k++){
				int size_x = ((i+1)*size.block_size < size.d1) ? size.block_size : size.d1 - i*size.block_size;
				int size_y = ((j+1)*size.block_size < size.d2) ? size.block_size : size.d2 - j*size.block_size;
				int size_z = ((k+1)*size.block_size < size.d3) ? size.block_size : size.d3 - k*size.block_size;
				int min_size = MIN(size_x, size_y);
				min_size = MIN(min_size, size_z);
				// size of block is less than some threshold
				if(min_size < RegThresholdSize3d){
					*indicator_pos = 0;
				}
				else{
					compute_regression_coeffcients_3d(z_data_pos, size_x, size_y, size_z, size.dim0_offset, size.dim1_offset, reg_params_pos);
					*indicator_pos = sz_blockwise_selection_3d(z_data_pos, mean_info, size.dim0_offset, size.dim1_offset, min_size, noise, reg_params_pos);
				}
				if(*indicator_pos){
					// regression
					compress_regression_coefficient_3d(reg_precisions, reg_params_pos, reg_params_type_pos, reg_unpredictable_data_pos);
					block_pred_and_quant_regression_3d(z_data_pos, reg_params_pos, precision, capacity, intv_radius, 
						size_x, size_y, size_z, size.dim0_offset, size.dim1_offset, type_pos, unpredictable_data_pos);
					reg_count ++;
					reg_params_pos += RegCoeffNum3d;
					reg_params_type_pos += RegCoeffNum3d;
				}
				else{
					// Lorenzo
					block_pred_and_quant_lorenzo_3d(mean_info, z_data_pos, pred_buffer, precision, capacity_lorenzo, intv_radius, 
						size_x, size_y, size_z, buffer_dim0_offset, buffer_dim1_offset, size.dim0_offset, size.dim1_offset, type_pos, unpredictable_data_pos);
				}
				indicator_pos ++;
				z_data_pos += size_z;
			}
			y_data_pos += size.block_size*size.dim1_offset;
		}
		x_data_pos += size.block_size*size.dim0_offset;
	}
	free(pred_buffer);
	free(reg_params);
	return reg_count;
}